

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

int Fl::handle_(int e,Fl_Window *window)

{
  _func_void_Fl_Widget_ptr *p_Var1;
  int iVar2;
  Fl_Widget *pFVar3;
  byte *pbVar4;
  Fl_Widget *pFVar5;
  Fl_Window *pFVar6;
  Fl_Window *pFVar7;
  byte local_94;
  Fl_Window *local_90;
  Fl_Window *local_88;
  bool local_61;
  uchar *c;
  int r;
  Fl_Widget *pbm;
  Fl_Window *pFStack_20;
  int ret;
  Fl_Widget *wi;
  Fl_Window *window_local;
  int e_local;
  
  e_number = e;
  if (fl_local_grab != (_func_int_int *)0x0) {
    iVar2 = (*fl_local_grab)(e);
    return iVar2;
  }
  wi = (Fl_Widget *)window;
  window_local._0_4_ = e;
  pFStack_20 = window;
  switch(e) {
  case 1:
    pFVar6 = grab();
    if (pFVar6 == (Fl_Window *)0x0) {
      pFVar6 = modal();
      if ((pFVar6 != (Fl_Window *)0x0) && (pFVar6 = modal(), window != pFVar6)) {
        return 0;
      }
    }
    else {
      pFStack_20 = grab();
    }
    pushed_ = (Fl_Widget *)pFStack_20;
    Fl_Tooltip::current((Fl_Widget *)pFStack_20);
    iVar2 = send_event(e,(Fl_Widget *)pFStack_20,window);
    if (iVar2 == 0) {
      (*(window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
      window_local._4_4_ = 1;
    }
    else {
      window_local._4_4_ = 1;
    }
    break;
  case 2:
    pFVar6 = grab();
    if (pFVar6 == (Fl_Window *)0x0) {
      pFVar5 = pushed();
      if (pFVar5 == (Fl_Widget *)0x0) {
        pFVar6 = modal();
        if ((pFVar6 != (Fl_Window *)0x0) && (pFVar6 = modal(), window != pFVar6)) {
          return 0;
        }
      }
      else {
        pFStack_20 = (Fl_Window *)pushed();
        pushed_ = (Fl_Widget *)0x0;
      }
    }
    else {
      pFStack_20 = grab();
      pushed_ = (Fl_Widget *)0x0;
    }
    window_local._4_4_ = send_event(e,(Fl_Widget *)pFStack_20,window);
    fl_fix_focus();
    break;
  case 3:
    fl_xmousewin = window;
    fl_fix_focus();
    p_Var1 = Fl_Tooltip::enter;
    pFVar5 = belowmouse();
    (*p_Var1)(pFVar5);
    window_local._4_4_ = 1;
    break;
  case 4:
    if (pushed_ == (Fl_Widget *)0x0) {
      belowmouse((Fl_Widget *)0x0);
      (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
    }
    if (window == fl_xmousewin) {
      fl_xmousewin = (Fl_Window *)0x0;
      fl_fix_focus();
    }
    window_local._4_4_ = 1;
    break;
  case 5:
  case 0xb:
    fl_xmousewin = window;
    pFVar5 = pushed();
    if (pFVar5 == (Fl_Widget *)0x0) {
      pFVar6 = modal();
      if ((pFVar6 != (Fl_Window *)0x0) && (pFVar6 = modal(), window != pFVar6)) {
        pFStack_20 = (Fl_Window *)0x0;
      }
      pFVar6 = grab();
      if (pFVar6 != (Fl_Window *)0x0) {
        pFStack_20 = grab();
      }
      pFVar5 = belowmouse();
      local_61 = false;
      if (pFStack_20 != (Fl_Window *)0x0) {
        iVar2 = send_event(e,(Fl_Widget *)pFStack_20,window);
        local_61 = iVar2 != 0;
      }
      pFVar3 = belowmouse();
      p_Var1 = Fl_Tooltip::enter;
      if (pFVar5 == pFVar3) {
        return (uint)local_61;
      }
      pFVar5 = belowmouse();
      (*p_Var1)(pFVar5);
      return (uint)local_61;
    }
    pFStack_20 = (Fl_Window *)pushed();
    pFVar6 = grab();
    if (pFVar6 != (Fl_Window *)0x0) {
      pFStack_20 = grab();
    }
    window_local._0_4_ = 5;
    e_number = 5;
    goto LAB_001d043d;
  case 7:
    wi = (Fl_Widget *)0x0;
  case 6:
    fl_xfocus = (Fl_Window *)wi;
    fl_fix_focus();
    return 1;
  case 8:
    (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
    fl_xfocus = window;
    pFVar6 = grab();
    if (pFVar6 == (Fl_Window *)0x0) {
      local_90 = (Fl_Window *)focus();
    }
    else {
      local_90 = grab();
    }
    for (pFStack_20 = local_90; pFStack_20 != (Fl_Window *)0x0;
        pFStack_20 = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)pFStack_20)) {
      iVar2 = send_event(8,(Fl_Widget *)pFStack_20,window);
      if (iVar2 != 0) {
        return 1;
      }
    }
    iVar2 = handle(0xc,window);
    if (iVar2 != 0) {
      return 1;
    }
    pbVar4 = (byte *)event_text();
    iVar2 = isalpha((uint)*pbVar4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = isupper((uint)*pbVar4);
    if (iVar2 == 0) {
      iVar2 = toupper((uint)*pbVar4);
      local_94 = (byte)iVar2;
    }
    else {
      iVar2 = tolower((uint)*pbVar4);
      local_94 = (byte)iVar2;
    }
    *pbVar4 = local_94;
    window_local._0_4_ = 0xc;
  case 0xc:
    e_number = (int)window_local;
    pFVar6 = grab();
    if (pFVar6 == (Fl_Window *)0x0) {
      pFVar5 = belowmouse();
      pFStack_20 = (Fl_Window *)find_active(pFVar5);
      if (pFStack_20 == (Fl_Window *)0x0) {
        pFStack_20 = modal();
        if (pFStack_20 == (Fl_Window *)0x0) {
          pFStack_20 = window;
        }
      }
      else {
        pFVar6 = Fl_Widget::window((Fl_Widget *)pFStack_20);
        pFVar7 = first_window();
        if (pFVar6 != pFVar7) {
          pFVar6 = first_window();
          pFVar7 = first_window();
          iVar2 = send_event(0xc,(Fl_Widget *)pFVar6,pFVar7);
          if (iVar2 != 0) {
            return 1;
          }
        }
      }
      for (; pFStack_20 != (Fl_Window *)0x0;
          pFStack_20 = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)pFStack_20)) {
        pFVar6 = Fl_Widget::window((Fl_Widget *)pFStack_20);
        iVar2 = send_event(0xc,(Fl_Widget *)pFStack_20,pFVar6);
        if (iVar2 != 0) {
          return 1;
        }
      }
      iVar2 = send_handlers(0xc);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = event_key();
      if (iVar2 == 0xff1b) {
        pFStack_20 = modal();
        if (pFStack_20 == (Fl_Window *)0x0) {
          pFStack_20 = window;
        }
        Fl_Widget::do_callback((Fl_Widget *)pFStack_20);
        return 1;
      }
      return 0;
    }
    pFStack_20 = grab();
    goto LAB_001d043d;
  case 9:
    pFVar6 = grab();
    if (pFVar6 == (Fl_Window *)0x0) {
      local_88 = (Fl_Window *)focus();
    }
    else {
      local_88 = grab();
    }
    for (pFStack_20 = local_88; pFStack_20 != (Fl_Window *)0x0;
        pFStack_20 = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)pFStack_20)) {
      iVar2 = send_event(9,(Fl_Widget *)pFStack_20,window);
      if (iVar2 != 0) {
        return 1;
      }
    }
    window_local._4_4_ = 0;
    break;
  case 10:
    pFVar6 = grab();
    if ((pFVar6 == (Fl_Window *)0x0) &&
       ((pFVar6 = modal(), pFVar6 == (Fl_Window *)0x0 || (pFVar6 = modal(), window == pFVar6)))) {
      Fl_Widget::do_callback((Fl_Widget *)window);
      window_local._4_4_ = 1;
    }
    else {
      window_local._4_4_ = 0;
    }
    break;
  case 0xf:
    Fl_Widget::hide((Fl_Widget *)window);
    window_local._4_4_ = 1;
    break;
  case 0x10:
    Fl_Widget::show((Fl_Widget *)window);
    window_local._4_4_ = 1;
    break;
  case 0x13:
    fl_xfocus = window;
    pFVar6 = grab();
    if (pFVar6 != (Fl_Window *)0x0) {
      pFVar6 = grab();
      pFVar7 = modal();
      if ((pFVar6 != pFVar7) && (pFVar6 = grab(), pFVar6 != window)) {
        pFVar6 = grab();
        iVar2 = send_event(0x13,(Fl_Widget *)pFVar6,window);
        if (iVar2 != 0) {
          return 1;
        }
      }
    }
    pFVar6 = modal();
    if (pFVar6 != (Fl_Window *)0x0) {
      pFVar6 = modal();
      send_event(0x13,(Fl_Widget *)pFVar6,window);
      return 1;
    }
    iVar2 = send_event(0x13,(Fl_Widget *)window,window);
    if (iVar2 != 0) {
      return 1;
    }
  default:
    goto LAB_001d043d;
  case 0x14:
  case 0x15:
    dnd_flag = '\x01';
    goto LAB_001d043d;
  case 0x16:
    dnd_flag = '\x01';
    belowmouse((Fl_Widget *)0x0);
    dnd_flag = '\0';
    window_local._4_4_ = 1;
    break;
  case 0x17:
    pFStack_20 = (Fl_Window *)belowmouse();
LAB_001d043d:
    if ((pFStack_20 == (Fl_Window *)0x0) ||
       (iVar2 = send_event((int)window_local,(Fl_Widget *)pFStack_20,window), iVar2 == 0)) {
      dnd_flag = '\0';
      window_local._4_4_ = send_handlers((int)window_local);
    }
    else {
      dnd_flag = '\0';
      window_local._4_4_ = 1;
    }
  }
  return window_local._4_4_;
}

Assistant:

int Fl::handle_(int e, Fl_Window* window)
{
  e_number = e;
  if (fl_local_grab) return fl_local_grab(e);

  Fl_Widget* wi = window;

  switch (e) {

  case FL_CLOSE:
    if ( grab() || (modal() && window != modal()) ) return 0;
    wi->do_callback();
    return 1;

  case FL_SHOW:
    wi->Fl_Widget::show(); // this calls Fl_Widget::show(), not Fl_Window::show()
    return 1;

  case FL_HIDE:
    wi->Fl_Widget::hide(); // this calls Fl_Widget::hide(), not Fl_Window::hide()
    return 1;

  case FL_PUSH:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    if (grab()) wi = grab();
    else if (modal() && wi != modal()) return 0;
    pushed_ = wi;
    Fl_Tooltip::current(wi);
    if (send_event(e, wi, window)) return 1;
    // raise windows that are clicked on:
    window->show();
    return 1;

  case FL_DND_ENTER:
  case FL_DND_DRAG:
    dnd_flag = 1;
    break;

  case FL_DND_LEAVE:
    dnd_flag = 1;
    belowmouse(0);
    dnd_flag = 0;
    return 1;

  case FL_DND_RELEASE:
    wi = belowmouse();
    break;

  case FL_MOVE:
  case FL_DRAG:
    fl_xmousewin = window; // this should already be set, but just in case.
    if (pushed()) {
      wi = pushed();
      if (grab()) wi = grab();
      e_number = e = FL_DRAG;
      break;
    }
    if (modal() && wi != modal()) wi = 0;
    if (grab()) wi = grab();
    { int ret;
      Fl_Widget* pbm = belowmouse();
#ifdef __APPLE__
      if (fl_mac_os_version < 100500) {
        // before 10.5, mouse moved events aren't sent to borderless windows such as tooltips
	Fl_Window *tooltip = Fl_Tooltip::current_window();
	int inside = 0;
	if (tooltip && tooltip->shown() ) { // check if a tooltip window is currently opened
	  // check if mouse is inside the tooltip
	  inside = (Fl::event_x_root() >= tooltip->x() && Fl::event_x_root() < tooltip->x() + tooltip->w() &&
	  Fl::event_y_root() >= tooltip->y() && Fl::event_y_root() < tooltip->y() + tooltip->h() );
	}
	// if inside, send event to tooltip window instead of background window
	if (inside) ret = send_event(e, tooltip, window);
	else ret = (wi && send_event(e, wi, window));
      } else
#endif
      ret = (wi && send_event(e, wi, window));
   if (pbm != belowmouse()) {
#ifdef DEBUG
      printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG
      Fl_Tooltip::enter(belowmouse());
    }
    return ret;}

  case FL_RELEASE: {
//    printf("FL_RELEASE: window=%p, pushed() = %p, grab() = %p, modal() = %p\n",
//           window, pushed(), grab(), modal());

    if (grab()) {
      wi = grab();
      pushed_ = 0; // must be zero before callback is done!
    } else if (pushed()) {
      wi = pushed();
      pushed_ = 0; // must be zero before callback is done!
    } else if (modal() && wi != modal()) return 0;
    int r = send_event(e, wi, window);
    fl_fix_focus();
    return r;}

  case FL_UNFOCUS:
    window = 0;
  case FL_FOCUS:
    fl_xfocus = window;
    fl_fix_focus();
    return 1;

  case FL_KEYUP:
    // Send the key-up to the current focus widget. This is not
    // always the same widget that received the corresponding
    // FL_KEYBOARD event because focus may have changed.
    // Sending the KEYUP to the right KEYDOWN is possible, but
    // would require that we track the KEYDOWN for every possible
    // key stroke (users may hold down multiple keys!) and then
    // make sure that the widget still exists before sending
    // a KEYUP there. I believe that the current solution is
    // "close enough".
    for (wi = grab() ? grab() : focus(); wi; wi = wi->parent())
      if (send_event(FL_KEYUP, wi, window)) return 1;
    return 0;

  case FL_KEYBOARD:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    Fl_Tooltip::enter((Fl_Widget*)0);

    fl_xfocus = window; // this should not happen!  But maybe it does:

    // Try it as keystroke, sending it to focus and all parents:
    for (wi = grab() ? grab() : focus(); wi; wi = wi->parent())
      if (send_event(FL_KEYBOARD, wi, window)) return 1;

    // recursive call to try shortcut:
    if (handle(FL_SHORTCUT, window)) return 1;

    // and then try a shortcut with the case of the text swapped, by
    // changing the text and falling through to FL_SHORTCUT case:
    {unsigned char* c = (unsigned char*)event_text(); // cast away const
    if (!isalpha(*c)) return 0;
    *c = isupper(*c) ? tolower(*c) : toupper(*c);}
    e_number = e = FL_SHORTCUT;

  case FL_SHORTCUT:
    if (grab()) {wi = grab(); break;} // send it to grab window

    // Try it as shortcut, sending to mouse widget and all parents:
    wi = find_active(belowmouse()); // STR #3216
    if (!wi) {
      wi = modal();
      if (!wi) wi = window;
    } else if (wi->window() != first_window()) {
      if (send_event(FL_SHORTCUT, first_window(), first_window())) return 1;
    }

    for (; wi; wi = wi->parent()) {
      if (send_event(FL_SHORTCUT, wi, wi->window())) return 1;
    }

    // try using add_handle() functions:
    if (send_handlers(FL_SHORTCUT)) return 1;

    // make Escape key close windows:
    if (event_key()==FL_Escape) {
      wi = modal(); if (!wi) wi = window;
      wi->do_callback();
      return 1;
    }

    return 0;

  case FL_ENTER:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    fl_xmousewin = window;
    fl_fix_focus();
    Fl_Tooltip::enter(belowmouse());
    return 1;

  case FL_LEAVE:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    if (!pushed_) {
      belowmouse(0);
      Fl_Tooltip::enter(0);
    }
    if (window == fl_xmousewin) {fl_xmousewin = 0; fl_fix_focus();}
    return 1;

  case FL_MOUSEWHEEL:
    fl_xfocus = window; // this should not happen!  But maybe it does:

    // Try sending it to the "grab" first
    if (grab() && grab()!=modal() && grab()!=window) {
      if (send_event(FL_MOUSEWHEEL, grab(), window)) return 1;
    }
    // Now try sending it to the "modal" window
    if (modal()) {
      send_event(FL_MOUSEWHEEL, modal(), window);
      return 1;
    }
    // Finally try sending it to the window, the event occured in
    if (send_event(FL_MOUSEWHEEL, window, window)) return 1;
  default:
    break;
  }
  if (wi && send_event(e, wi, window)) {
    dnd_flag = 0;
    return 1;
  }
  dnd_flag = 0;
  return send_handlers(e);
}